

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.cpp
# Opt level: O2

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  int iVar1;
  ulong __n;
  
  while( true ) {
    if (n == 0) {
      return 0;
    }
    iVar1 = luaZ_lookahead(z);
    if (iVar1 == -1) break;
    __n = z->n;
    if (n < z->n) {
      __n = n;
    }
    memcpy(b,z->p,__n);
    z->n = z->n - __n;
    z->p = z->p + __n;
    b = (void *)((long)b + __n);
    n = n - __n;
  }
  return n;
}

Assistant:

size_t luaZ_read (ZIO *z, void *b, size_t n) {
  while (n) {
    size_t m;
    if (luaZ_lookahead(z) == EOZ)
      return n;  /* return number of missing bytes */
    m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
    memcpy(b, z->p, m);
    z->n -= m;
    z->p += m;
    b = (char *)b + m;
    n -= m;
  }
  return 0;
}